

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O1

void __thiscall
wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  pointer pLVar1;
  HeapType this_00;
  Struct *pSVar2;
  StructValues<wasm::LUBFinder> *pSVar3;
  Type TVar4;
  uint uVar5;
  ulong uVar6;
  HeapType local_48;
  HeapType oldStructType_local;
  
  local_48.id = oldStructType.id;
  oldStructType_local.id = (uintptr_t)this;
  pSVar2 = HeapType::getStruct(&local_48);
  this_00.id = oldStructType_local.id;
  if ((struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 1;
    uVar6 = 0;
    do {
      TVar4.id = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6].type.id;
      if ((TVar4.id & 1) == 0 && 6 < TVar4.id) {
        pSVar3 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                           ((StructValuesMap<wasm::LUBFinder> *)
                            (*(long *)(this_00.id + 0x68) + 0x60),local_48);
        pLVar1 = (pSVar3->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                 super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(pSVar3->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                          super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 3) <= uVar6) {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                        ,0x27,
                        "T &wasm::StructUtils::StructValues<wasm::LUBFinder>::operator[](size_t) [T = wasm::LUBFinder]"
                       );
        }
        TVar4 = GlobalTypeRewriter::getTempType(this_00.id,pLVar1[uVar6].lub.id);
        (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6].type.id = TVar4.id;
      }
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar6 < (ulong)((long)(struct_->fields).
                                   super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(struct_->fields).
                                   super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        const auto& oldFields = oldStructType.getStruct().fields;
        auto& newFields = struct_.fields;

        for (Index i = 0; i < newFields.size(); i++) {
          auto oldType = oldFields[i].type;
          if (!oldType.isRef()) {
            continue;
          }
          auto newType = parent.finalInfos[oldStructType][i].getLUB();
          newFields[i].type = getTempType(newType);
        }
      }